

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O3

pcp_flow_t * pcp_create_flow(pcp_server_t *s,flow_key_data *fkd)

{
  undefined3 uVar1;
  pcp_flow_t *ppVar2;
  long lVar3;
  flow_key_data *pfVar4;
  byte bVar5;
  
  bVar5 = 0;
  if ((s != (pcp_server_t *)0x0) && (fkd != (flow_key_data *)0x0)) {
    ppVar2 = (pcp_flow_t *)calloc(1,0x368);
    if (ppVar2 == (pcp_flow_t *)0x0) {
      pcp_logger(PCP_LOGLVL_ERR,"%s","Malloc can\'t allocate enough memory for the pcp_flow.");
      pcp_logger(PCP_LOGLVL_ERR,"%s","Returning NULL.");
    }
    else {
      ppVar2->pcp_server_indx = s->index;
      pfVar4 = &ppVar2->kd;
      for (lVar3 = 0x13; lVar3 != 0; lVar3 = lVar3 + -1) {
        uVar1 = *(undefined3 *)&fkd->field_0x1;
        pfVar4->operation = fkd->operation;
        *(undefined3 *)&pfVar4->field_0x1 = uVar1;
        fkd = (flow_key_data *)((long)fkd + (ulong)bVar5 * -8 + 4);
        pfVar4 = (flow_key_data *)((long)pfVar4 + (ulong)bVar5 * -8 + 4);
      }
      ppVar2->key_bucket = 0xffffffff;
      ppVar2->ctx = s->ctx;
    }
    return ppVar2;
  }
  __assert_fail("fkd && s",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0x45,"pcp_flow_t *pcp_create_flow(pcp_server_t *, struct flow_key_data *)");
}

Assistant:

pcp_flow_t *pcp_create_flow(pcp_server_t *s, struct flow_key_data *fkd) {
    pcp_flow_t *flow;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    assert(fkd && s);

    flow = (pcp_flow_t *)calloc(1, sizeof(struct pcp_flow_s));
    if (flow == NULL) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Malloc can't allocate enough memory for the pcp_flow.");
        PCP_LOG(PCP_LOGLVL_ERR, "%s", "Returning NULL.");
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return NULL;
    }

    flow->pcp_msg_len = 0;
    flow->pcp_server_indx = (s ? s->index : PCP_INV_SERVER);
    flow->kd = *fkd;
    flow->key_bucket = EMPTY;
    flow->ctx = s->ctx;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return flow;
}